

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int decode_stored_session_ticket
              (ptls_context_t *ctx,ptls_cipher_suite_t **cs,ptls_iovec_t *secret,
              uint32_t *obfuscated_ticket_age,ptls_iovec_t *ticket,uint32_t *max_early_data_size,
              uint8_t *src,uint8_t *end)

{
  uint32_t *puVar1;
  uint8_t *puVar2;
  uint64_t uVar3;
  uint8_t *puVar4;
  ptls_iovec_t pVar5;
  ptls_cipher_suite_t *local_a8;
  ptls_cipher_suite_t **cand;
  size_t local_98;
  uint8_t *end_2;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t *end_1;
  size_t _block_size;
  size_t _capacity;
  int ret;
  uint64_t now;
  uint64_t obtained_at;
  uint32_t local_40;
  uint32_t age_add;
  uint32_t lifetime;
  uint16_t csid;
  uint32_t *max_early_data_size_local;
  ptls_iovec_t *ticket_local;
  uint32_t *obfuscated_ticket_age_local;
  ptls_iovec_t *secret_local;
  ptls_cipher_suite_t **cs_local;
  ptls_context_t *ctx_local;
  
  _lifetime = max_early_data_size;
  max_early_data_size_local = (uint32_t *)ticket;
  ticket_local = (ptls_iovec_t *)obfuscated_ticket_age;
  obfuscated_ticket_age_local = (uint32_t *)secret;
  secret_local = (ptls_iovec_t *)cs;
  cs_local = (ptls_cipher_suite_t **)ctx;
  _capacity._4_4_ = decode64(&now,&src,end);
  if ((_capacity._4_4_ == 0) &&
     (_capacity._4_4_ = decode16((uint16_t *)((long)&age_add + 2),&src,end), _capacity._4_4_ == 0))
  {
    _block_size = 3;
    if ((ulong)((long)end - (long)src) < 3) {
      _capacity._4_4_ = 0x32;
    }
    else {
      end_1 = (uint8_t *)0x0;
      do {
        puVar4 = src + 1;
        end_1 = (uint8_t *)((long)end_1 << 8 | (ulong)*src);
        _block_size = _block_size - 1;
        src = puVar4;
      } while (_block_size != 0);
      if (end + -(long)puVar4 < end_1) {
        _capacity._4_4_ = 0x32;
      }
      else {
        puVar2 = puVar4 + (long)end_1;
        _capacity._4_4_ =
             decode_new_session_ticket
                       (&local_40,(uint32_t *)((long)&obtained_at + 4),
                        (ptls_iovec_t *)max_early_data_size_local,_lifetime,puVar4,puVar2);
        puVar1 = obfuscated_ticket_age_local;
        if (_capacity._4_4_ == 0) {
          _block_size_1 = 2;
          if ((ulong)((long)end - (long)puVar2) < 2) {
            _capacity._4_4_ = 0x32;
          }
          else {
            end_2 = (uint8_t *)0x0;
            src = puVar2;
            do {
              puVar4 = src + 1;
              end_2 = (uint8_t *)((long)end_2 << 8 | (ulong)*src);
              _block_size_1 = _block_size_1 - 1;
              src = puVar4;
            } while (_block_size_1 != 0);
            if (end + -(long)puVar4 < end_2) {
              _capacity._4_4_ = 0x32;
            }
            else {
              puVar2 = puVar4 + (long)end_2;
              pVar5 = ptls_iovec_init(puVar4,(long)puVar2 - (long)puVar4);
              cand = (ptls_cipher_suite_t **)pVar5.base;
              *(ptls_cipher_suite_t ***)puVar1 = cand;
              local_98 = pVar5.len;
              *(size_t *)(puVar1 + 2) = local_98;
              if (puVar2 == end) {
                for (local_a8 = cs_local[2];
                    (*(long *)local_a8 != 0 && (**(short **)local_a8 != age_add._2_2_));
                    local_a8 = (ptls_cipher_suite_t *)&local_a8->aead) {
                }
                if (*(long *)local_a8 == 0) {
                  _capacity._4_4_ = 0x203;
                }
                else {
                  secret_local->base = *(uint8_t **)local_a8;
                  src = puVar2;
                  uVar3 = gettime_millis();
                  if ((uVar3 < now) || (0x240c83ff < uVar3 - now)) {
                    _capacity._4_4_ = 0x203;
                  }
                  else {
                    *(int *)&ticket_local->base = ((int)uVar3 - (int)now) + obtained_at._4_4_;
                    _capacity._4_4_ = 0;
                  }
                }
              }
              else {
                _capacity._4_4_ = 0x32;
              }
            }
          }
        }
      }
    }
  }
  return _capacity._4_4_;
}

Assistant:

static int decode_stored_session_ticket(ptls_context_t *ctx, ptls_cipher_suite_t **cs, ptls_iovec_t *secret,
                                        uint32_t *obfuscated_ticket_age, ptls_iovec_t *ticket, uint32_t *max_early_data_size,
                                        const uint8_t *src, const uint8_t *end)
{
    uint16_t csid;
    uint32_t lifetime, age_add;
    uint64_t obtained_at, now;
    int ret;

    /* decode */
    if ((ret = decode64(&obtained_at, &src, end)) != 0)
        goto Exit;
    if ((ret = decode16(&csid, &src, end)) != 0)
        goto Exit;
    decode_open_block(src, end, 3, {
        if ((ret = decode_new_session_ticket(&lifetime, &age_add, ticket, max_early_data_size, src, end)) != 0)
            goto Exit;
        src = end;
    });
    decode_block(src, end, 2, {
        *secret = ptls_iovec_init(src, end - src);
        src = end;
    });

    { /* determine the cipher-suite */
        ptls_cipher_suite_t **cand;
        for (cand = ctx->cipher_suites; *cand != NULL; ++cand)
            if ((*cand)->id == csid)
                break;
        if (*cand == NULL) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        *cs = *cand;
    }

    /* calculate obfuscated_ticket_age */
    now = gettime_millis();
    if (!(obtained_at <= now && now - obtained_at < 7 * 86400 * 1000)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    *obfuscated_ticket_age = (uint32_t)(now - obtained_at) + age_add;

    ret = 0;
Exit:
    return ret;
}